

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-chatd.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  int __fd;
  int iVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  telnet_t *telnet;
  ssize_t sVar6;
  FILE *pFVar7;
  char *pcVar8;
  user_t *puVar9;
  int rs;
  socklen_t addrlen;
  sockaddr local_458;
  pollfd pfd [65];
  char buffer [512];
  
  if (argc == 2) {
    memset(pfd,0,0x208);
    memset(users,0,0x4800);
    for (lVar3 = 8; lVar3 != 0x4808; lVar3 = lVar3 + 0x120) {
      pcVar5 = users[0].linebuf + lVar3 + -0x18;
      pcVar5[0] = -1;
      pcVar5[1] = -1;
      pcVar5[2] = -1;
      pcVar5[3] = -1;
    }
    lVar3 = strtol(argv[1],(char **)0x0,10);
    __fd = socket(2,1,0);
    pFVar7 = _stderr;
    if (__fd == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      pcVar8 = "socket() failed: %s\n";
LAB_00101405:
      fprintf(pFVar7,pcVar8,pcVar5);
    }
    else {
      rs = 1;
      setsockopt(__fd,1,2,&rs,4);
      local_458.sa_data[6] = '\0';
      local_458.sa_data[7] = '\0';
      local_458.sa_data[8] = '\0';
      local_458.sa_data[9] = '\0';
      local_458.sa_data[10] = '\0';
      local_458.sa_data[0xb] = '\0';
      local_458.sa_data[0xc] = '\0';
      local_458.sa_data[0xd] = '\0';
      local_458.sa_family = 2;
      local_458.sa_data[2] = '\0';
      local_458.sa_data[3] = '\0';
      local_458.sa_data[4] = '\0';
      local_458.sa_data[5] = '\0';
      uVar1 = (ushort)lVar3;
      local_458.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
      iVar2 = bind(__fd,&local_458,0x10);
      pFVar7 = _stderr;
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        pcVar8 = "bind() failed: %s\n";
      }
      else {
        iVar2 = listen(__fd,5);
        pFVar7 = _stderr;
        if (iVar2 != -1) {
          printf("LISTENING ON PORT %d\n",(ulong)(uint)(int)(short)uVar1);
          pfd[0x40].events = 1;
          pfd[0x40].fd = __fd;
          do {
            for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
              iVar2 = users[lVar3].sock;
              pfd[lVar3].fd = iVar2;
              pfd[lVar3].events = (ushort)(iVar2 != -1);
            }
            rs = poll((pollfd *)pfd,0x41,-1);
            if (rs == -1) {
              piVar4 = __errno_location();
              pFVar7 = _stderr;
              if (*piVar4 != 4) {
                pcVar5 = strerror(*piVar4);
                fprintf(pFVar7,"poll() failed: %s\n",pcVar5);
                goto LAB_001014bb;
              }
            }
            if (((byte)pfd[0x40].revents & 0x19) != 0) {
              addrlen = 0x10;
              iVar2 = accept(__fd,&local_458,&addrlen);
              pFVar7 = _stderr;
              if (iVar2 == -1) {
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                pcVar8 = "accept() failed: %s\n";
                goto LAB_00101405;
              }
              puts("Connection received.");
              piVar4 = &users[0].sock;
              for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
                if (*piVar4 == -1) goto LAB_001015e8;
                piVar4 = piVar4 + 0x48;
              }
              puts("  rejected (too many users)");
              _send(iVar2,"Too many users.\r\n",0xe);
              close(iVar2);
              lVar3 = 0x40;
LAB_001015e8:
              users[lVar3].sock = iVar2;
              telnet = telnet_init(telopts,_event_handler,'\0',users + lVar3);
              users[lVar3].telnet = telnet;
              telnet_negotiate(telnet,0xfb,0x56);
              telnet_printf(users[lVar3].telnet,"Enter name: ");
              telnet_negotiate(users[lVar3].telnet,0xfb,1);
            }
            puVar9 = users;
            for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
              if ((puVar9->sock != -1) && ((pfd[lVar3].revents & 0x19) != 0)) {
                sVar6 = recv(puVar9->sock,buffer,0x200,0);
                rs = (int)sVar6;
                if (rs < 1) {
                  if (rs == 0) {
                    puts("Connection closed.");
                    close(puVar9->sock);
                    puVar9->sock = -1;
                    if (puVar9->name != (char *)0x0) {
                      _message(puVar9->name,"** HAS DISCONNECTED **");
                      free(puVar9->name);
                      puVar9->name = (char *)0x0;
                    }
                    telnet_free(puVar9->telnet);
                  }
                  else {
                    piVar4 = __errno_location();
                    pFVar7 = _stderr;
                    if (*piVar4 != 4) {
                      pcVar5 = strerror(*piVar4);
                      fprintf(pFVar7,"recv(client) failed: %s\n",pcVar5);
                      exit(1);
                    }
                  }
                }
                else {
                  telnet_recv(puVar9->telnet,buffer,(ulong)(rs & 0x7fffffff));
                }
              }
              puVar9 = puVar9 + 1;
            }
          } while( true );
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        pcVar8 = "listen() failed: %s\n";
      }
      fprintf(pFVar7,pcVar8,pcVar5);
LAB_001014bb:
      close(__fd);
    }
  }
  else {
    fwrite("Usage:\n ./telnet-chatd <port>\n",0x1e,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	SOCKET client_sock;
	int rs;
	int i;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[MAX_USERS + 1];

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 2) {
		fprintf(stderr, "Usage:\n ./telnet-chatd <port>\n");
		return 1;
	}

	/* initialize data structures */
	memset(&pfd, 0, sizeof(pfd));
	memset(users, 0, sizeof(users));
	for (i = 0; i != MAX_USERS; ++i)
		users[i].sock = -1;

	/* parse listening port */
	listen_port = (short)strtol(argv[1], 0, 10);

	/* create listening socket */
	if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* reuse address option */
	rs = 1;
	setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

	/* bind to listening addr/port */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(listen_port);
	if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	/* listen for clients */
	if (listen(listen_sock, 5) == -1) {
		fprintf(stderr, "listen() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	printf("LISTENING ON PORT %d\n", listen_port);

	/* initialize listening descriptors */
	pfd[MAX_USERS].fd = listen_sock;
	pfd[MAX_USERS].events = POLLIN;

	/* loop for ever */
	for (;;) {
		/* prepare for poll */
		for (i = 0; i != MAX_USERS; ++i) {
			if (users[i].sock != -1) {
				pfd[i].fd = users[i].sock;
				pfd[i].events = POLLIN;
			} else {
				pfd[i].fd = -1;
				pfd[i].events = 0;
			}
		}

		/* poll */
		rs = poll(pfd, MAX_USERS + 1, -1);
		if (rs == -1 && errno != EINTR) {
			fprintf(stderr, "poll() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		/* new connection */
		if (pfd[MAX_USERS].revents & (POLLIN | POLLERR | POLLHUP)) {
			/* acept the sock */
			addrlen = sizeof(addr);
			if ((client_sock = accept(listen_sock, (struct sockaddr *)&addr,
					&addrlen)) == -1) {
				fprintf(stderr, "accept() failed: %s\n", strerror(errno));
				return 1;
			}

			printf("Connection received.\n");

			/* find a free user */
			for (i = 0; i != MAX_USERS; ++i)
				if (users[i].sock == -1)
					break;
			if (i == MAX_USERS) {
				printf("  rejected (too many users)\n");
				_send(client_sock, "Too many users.\r\n", 14);
				close(client_sock);
			}

			/* init, welcome */
			users[i].sock = client_sock;
			users[i].telnet = telnet_init(telopts, _event_handler, 0,
					&users[i]);
			telnet_negotiate(users[i].telnet, TELNET_WILL,
					TELNET_TELOPT_COMPRESS2);
			telnet_printf(users[i].telnet, "Enter name: ");

			telnet_negotiate(users[i].telnet, TELNET_WILL, TELNET_TELOPT_ECHO);
		}

		/* read from client */
		for (i = 0; i != MAX_USERS; ++i) {
			/* skip users that aren't actually connected */
			if (users[i].sock == -1)
				continue;

			if (pfd[i].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(users[i].sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(users[i].telnet, buffer, rs);
				} else if (rs == 0) {
					printf("Connection closed.\n");
					close(users[i].sock);
					users[i].sock = -1;
					if (users[i].name != 0) {
						_message(users[i].name, "** HAS DISCONNECTED **");
						free(users[i].name);
						users[i].name = 0;
					}
					telnet_free(users[i].telnet);
				} else if (errno != EINTR) {
					fprintf(stderr, "recv(client) failed: %s\n",
							strerror(errno));
					exit(1);
				}
			}
		}
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}